

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> * __thiscall
TPZAutoPointer<TPZFunction<std::complex<long_double>_>_>::operator=
          (TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> *this,
          TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> *rval)

{
  bool bVar1;
  TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> *in_RSI;
  TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> *in_RDI;
  TPZReference *in_stack_00000018;
  
  if ((in_RDI->fRef != (TPZReference *)0x0) &&
     (bVar1 = TPZReference::Decrease(in_stack_00000018), bVar1)) {
    Release(in_RSI);
  }
  in_RDI->fRef = in_RSI->fRef;
  in_RSI->fRef = (TPZReference *)0x0;
  return in_RDI;
}

Assistant:

TPZAutoPointer &operator=(TPZAutoPointer<T> &&rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = rval.fRef;
        rval.fRef = nullptr;
        return *this;
    }